

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bof.hpp
# Opt level: O0

void __thiscall Excel::BOF::parse(BOF *this,Record *record)

{
  Record *in_RSI;
  undefined4 *in_RDI;
  int16_t type;
  int16_t version;
  
  Record::dataStream(in_RSI);
  Stream::read<short>((Stream *)this,(short *)record,_type);
  Record::dataStream(in_RSI);
  Stream::read<short>((Stream *)this,(short *)record,_type);
  *in_RDI = 0;
  in_RDI[1] = 0;
  return;
}

Assistant:

inline void
BOF::parse( Record & record )
{
	int16_t version = 0;
	int16_t type = 0;

	record.dataStream().read( version, 2 );
	record.dataStream().read( type, 2 );

	switch( version )
	{
		case BIFF8 :
			m_version = BIFF8;
			break;

		case BIFF7 :
			m_version = BIFF7;
			break;

		default :
			m_version = UnknownVersion;
			break;
	}

	switch( type )
	{
		case WorkBookGlobals :
			m_type = WorkBookGlobals;
			break;

		case VisualBasicModule :
			m_type = VisualBasicModule;
			break;

		case WorkSheet :
			m_type = WorkSheet;
			break;

		case Chart :
			m_type = Chart;
			break;

		case MacroSheet :
			m_type = MacroSheet;
			break;

		case WorkSpace :
			m_type = WorkSpace;
			break;

		default :
			m_type = UnknownType;
			break;
	}
}